

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceNameBufferLimitCase::iterate
          (ResourceNameBufferLimitCase *this)

{
  void *pvVar1;
  bool bVar2;
  Context *this_00;
  RenderContext *renderCtx;
  TestLog *pTVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  char *in_RCX;
  char *description;
  int *piVar7;
  ostringstream *poVar8;
  int iVar9;
  long lVar10;
  GLsizei written;
  char buffer [26];
  ScopedLogSection section;
  ShaderProgram program;
  int local_2dc;
  undefined1 local_2d8 [10];
  undefined6 uStack_2ce;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  int local_2ac;
  long local_2a8;
  string local_2a0;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [6];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_2a8 = CONCAT44(extraout_var,iVar4);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  memset(local_280,0,0xac);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a0,(_anonymous_namespace_ *)this_00,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout(local_size_x = 1) in;\nuniform highp int u_uniformWithALongName;\nwriteonly buffer OutputBufferBlock { highp int b_output_int; };\nvoid main ()\n{\n\tb_output_int = u_uniformWithALongName;\n}\n"
             ,in_RCX);
  local_2d8._0_4_ = 5;
  pvVar1 = (void *)((long)&local_2c8 + 8);
  local_2d8._8_2_ = SUB82(pvVar1,0);
  uStack_2ce = (undefined6)((ulong)pvVar1 >> 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2d8 + 8),local_2a0._M_dataplus._M_p,
             local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + (local_2d8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2d8 + 8));
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
  if ((void *)CONCAT62(uStack_2ce,local_2d8._8_2_) != pvVar1) {
    operator_delete((void *)CONCAT62(uStack_2ce,local_2d8._8_2_),
                    CONCAT62(local_2c8._10_6_,local_2c8._8_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_280._0_8_ = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"Program","");
  local_2d8._0_8_ = &local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"Program","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2a0,pTVar3,(string *)local_280,(string *)local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ != &local_2c8) {
    operator_delete((void *)local_2d8._0_8_,
                    CONCAT62(local_2c8._M_allocated_capacity._2_6_,
                             local_2c8._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ != local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270[0]._M_allocated_capacity + 1));
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&local_100
                 );
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    local_280._0_8_ = local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"could not build program","");
    tcu::TestError::TestError(pTVar6,(string *)local_280);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestLog::endSection((TestLog *)local_2a0._M_dataplus._M_p);
  local_2ac = (**(code **)(local_2a8 + 0x9a8))
                        (local_100.m_program.m_program,0x92e1,"u_uniformWithALongName");
  dVar5 = (**(code **)(local_2a8 + 0x800))();
  glu::checkError(dVar5,"query resource index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x5c6);
  if (local_2ac == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    local_280._0_8_ = local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,
               "Uniform u_uniformWithALongName resource index was GL_INVALID_INDEX","");
    tcu::TestError::TestError(pTVar6,(string *)local_280);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  lVar10 = 0;
  do {
    poVar8 = (ostringstream *)(local_280 + 8);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_280._0_8_ = local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"Query","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2d8,*(char **)((long)&iterate::querySizes[0].description + lVar10),
               (allocator<char> *)&local_2dc);
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_2a0,pTVar3,(string *)local_280,(string *)local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._0_8_ != &local_2c8) {
      operator_delete((void *)local_2d8._0_8_,
                      CONCAT62(local_2c8._M_allocated_capacity._2_6_,
                               local_2c8._M_allocated_capacity._0_2_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != local_270) {
      operator_delete((void *)local_280._0_8_,(ulong)(local_270[0]._M_allocated_capacity + 1));
    }
    iVar4 = *(int *)((long)&iterate::querySizes[0].querySize + lVar10);
    iVar9 = iVar4 + -1;
    if (0x15 < iVar4 + -1) {
      iVar9 = 0x16;
    }
    local_2dc = -1;
    local_2d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x7878787878787878;
    local_2d8._8_2_ = 0x7878;
    uStack_2ce = 0x787878787878;
    local_2c8._M_allocated_capacity._0_2_ = 0x7878;
    local_2c8._M_allocated_capacity._2_6_ = 0x787878787878;
    local_2c8._8_2_ = 0x7878;
    if (iVar4 == 0) {
      iVar9 = 0;
      local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar8 = (ostringstream *)(local_280 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar8,"Querying uniform name to a buffer of size ",0x2a);
      std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar8,", expecting query to write 0 bytes",0x22);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar8,"Querying uniform name to a buffer of size ",0x2a);
      std::ostream::operator<<(poVar8,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar8,", expecting query to write ",0x1b);
      std::ostream::operator<<(poVar8,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar8," bytes followed by a null terminator",0x24);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
    std::ios_base::~ios_base(local_208);
    bVar2 = (&iterate::querySizes[0].returnLength)[lVar10];
    piVar7 = (int *)0x0;
    if (bVar2 != false) {
      piVar7 = &local_2dc;
    }
    (**(code **)(local_2a8 + 0x9c0))
              (local_100.m_program.m_program,0x92e1,local_2ac,iVar4,piVar7,(string *)local_2d8);
    dVar5 = (**(code **)(local_2a8 + 0x800))();
    glu::checkError(dVar5,"query resource name",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x5fa);
    if ((bVar2 == false) || (local_2dc == iVar9)) {
      if (iVar4 != 0) {
        if (local_2d8[iVar9] == '\0') {
          if ((iVar4 == 0) || (local_2d8[(long)iVar9 + 1] == 'x')) goto LAB_01583fb4;
          local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar8 = (ostringstream *)(local_280 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar8,"Error, guard at index ",0x16);
          std::ostream::operator<<(poVar8,iVar9 + 1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar8," was modified, got dec=",0x17);
          std::ostream::operator<<(poVar8,(int)(char)local_2d8[(long)iVar9 + 1]);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
          std::ios_base::~ios_base(local_208);
          description = "Wrote over buffer size";
        }
        else {
          local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar8 = (ostringstream *)(local_280 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar8,"Error, expected null terminator at ",0x23);
          std::ostream::operator<<(poVar8,iVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,", got dec=",10);
          std::ostream::operator<<(poVar8,(int)(char)local_2d8[iVar9]);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
          std::ios_base::~ios_base(local_208);
          description = "Missing null terminator";
        }
        goto LAB_015840d2;
      }
LAB_01583fb4:
      if ((iVar4 == 0) && (local_2d8[0] != (string)0x78)) {
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar8 = (ostringstream *)(local_280 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar8,
                   "Error, buffer size was 0 but buffer contents were modified. At index 0 got dec="
                   ,0x4f);
        std::ostream::operator<<(poVar8,(int)(char)local_2d8[0]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        description = "Buffer contents were modified";
        goto LAB_015840d2;
      }
    }
    else {
      local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar8 = (ostringstream *)(local_280 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar8,"Error, expected write length of ",0x20);
      std::ostream::operator<<(poVar8,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,", got ",6);
      std::ostream::operator<<(poVar8,local_2dc);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar8);
      std::ios_base::~ios_base(local_208);
      description = "Unexpected write lenght";
LAB_015840d2:
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 description);
    }
    tcu::TestLog::endSection((TestLog *)local_2a0._M_dataplus._M_p);
    lVar10 = lVar10 + 0x10;
    if (lVar10 == 0x80) {
      glu::ShaderProgram::~ShaderProgram(&local_100);
      return STOP;
    }
  } while( true );
}

Assistant:

ResourceNameBufferLimitCase::IterateResult ResourceNameBufferLimitCase::iterate (void)
{
	static const char* const computeSource =	"${GLSL_VERSION_DECL}\n"
												"layout(local_size_x = 1) in;\n"
												"uniform highp int u_uniformWithALongName;\n"
												"writeonly buffer OutputBufferBlock { highp int b_output_int; };\n"
												"void main ()\n"
												"{\n"
												"	b_output_int = u_uniformWithALongName;\n"
												"}\n";

	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, computeSource)));
	glw::GLuint					uniformIndex;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Log program
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program", "Program");

		m_testCtx.getLog() << program;
		if (!program.isOk())
			throw tcu::TestError("could not build program");
	}

	uniformIndex = gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_uniformWithALongName");
	GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

	if (uniformIndex == GL_INVALID_INDEX)
		throw tcu::TestError("Uniform u_uniformWithALongName resource index was GL_INVALID_INDEX");

	// Query with different sized buffers, len("u_uniformWithALongName") == 22

	{
		static const struct
		{
			const char*	description;
			int			querySize;
			bool		returnLength;
		} querySizes[] =
		{
			{ "Query to larger buffer",										24,		true	},
			{ "Query to buffer the same size",								23,		true	},
			{ "Query to one byte too small buffer",							22,		true	},
			{ "Query to one byte buffer",									1,		true	},
			{ "Query to zero sized buffer",									0,		true	},
			{ "Query to one byte too small buffer, null length argument",	22,		false	},
			{ "Query to one byte buffer, null length argument",				1,		false	},
			{ "Query to zero sized buffer, null length argument",			0,		false	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(querySizes); ++ndx)
		{
			const tcu::ScopedLogSection			section				(m_testCtx.getLog(), "Query", querySizes[ndx].description);
			const int							uniformNameLen		= 22;
			const int							expectedWriteLen	= (querySizes[ndx].querySize != 0) ? (de::min(uniformNameLen, (querySizes[ndx].querySize - 1))) : (0);
			char								buffer				[26];
			glw::GLsizei						written				= -1;

			// One byte for guard
			DE_ASSERT((int)sizeof(buffer) > querySizes[ndx].querySize);

			deMemset(buffer, 'x', sizeof(buffer));

			if (querySizes[ndx].querySize)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Querying uniform name to a buffer of size " << querySizes[ndx].querySize
					<< ", expecting query to write " << expectedWriteLen << " bytes followed by a null terminator"
					<< tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Querying uniform name to a buffer of size " << querySizes[ndx].querySize
					<< ", expecting query to write 0 bytes"
					<< tcu::TestLog::EndMessage;

			gl.getProgramResourceName(program.getProgram(), GL_UNIFORM, uniformIndex, querySizes[ndx].querySize, (querySizes[ndx].returnLength) ? (&written) : (DE_NULL), buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query resource name");

			if (querySizes[ndx].returnLength && written != expectedWriteLen)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected write length of " << expectedWriteLen << ", got " << written << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected write lenght");
			}
			else if (querySizes[ndx].querySize != 0 && buffer[expectedWriteLen] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected null terminator at " << expectedWriteLen << ", got dec=" << (int)buffer[expectedWriteLen] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Missing null terminator");
			}
			else if (querySizes[ndx].querySize != 0 && buffer[expectedWriteLen+1] != 'x')
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, guard at index " << (expectedWriteLen+1) << " was modified, got dec=" << (int)buffer[expectedWriteLen+1] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Wrote over buffer size");
			}
			else if (querySizes[ndx].querySize == 0 && buffer[0] != 'x')
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, buffer size was 0 but buffer contents were modified. At index 0 got dec=" << (int)buffer[0] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents were modified");
			}
		}
	}

	return STOP;
}